

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

route_id __thiscall
helics::CoreBroker::fillMessageRouteInformation(CoreBroker *this,ActionMessage *mess)

{
  InterfaceHandle IVar1;
  route_id rVar2;
  string *__k;
  BasicHandleInfo *pBVar3;
  iterator iVar4;
  BaseType BVar5;
  string_view name;
  
  BVar5 = 0;
  __k = ActionMessage::getString_abi_cxx11_(mess,0);
  name._M_str = (__k->_M_dataplus)._M_p;
  name._M_len = __k->_M_string_length;
  pBVar3 = HandleManager::getInterfaceHandle(&this->handles,name,ENDPOINT);
  if (pBVar3 != (BasicHandleInfo *)0x0) {
    IVar1.hid = (pBVar3->handle).handle.hid;
    mess->dest_id = (GlobalFederateId)(pBVar3->handle).fed_id.gid;
    mess->dest_handle = (InterfaceHandle)IVar1.hid;
    rVar2 = getRoute(this,(GlobalFederateId)(pBVar3->handle).fed_id.gid);
    return (route_id)rVar2.rid;
  }
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->knownExternalEndpoints,__k);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
      ._M_cur != (__node_type *)0x0) {
    BVar5 = *(BaseType *)
             ((long)iVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
                    ._M_cur + 0x28);
  }
  return (route_id)BVar5;
}

Assistant:

route_id CoreBroker::fillMessageRouteInformation(ActionMessage& mess)
{
    const auto& endpointName = mess.getString(targetStringLoc);
    auto* eptInfo = handles.getInterfaceHandle(endpointName, InterfaceType::ENDPOINT);
    if (eptInfo != nullptr) {
        mess.setDestination(eptInfo->handle);
        return getRoute(eptInfo->handle.fed_id);
    }
    auto fnd2 = knownExternalEndpoints.find(endpointName);
    if (fnd2 != knownExternalEndpoints.end()) {
        return fnd2->second;
    }
    return parent_route_id;
}